

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub_string.cpp
# Opt level: O2

bool __thiscall sub_string::try_drop_prefix(sub_string *this,sub_string other)

{
  bool bVar1;
  
  bVar1 = has_prefix(this,other);
  if (bVar1) {
    advance(this,(long)other.end_ - (long)other.begin_);
  }
  return bVar1;
}

Assistant:

bool sub_string::try_drop_prefix(sub_string other)
{
    if (has_prefix(other))
    {
        advance(other.size());
        return true;
    }
    return false;
}